

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_lexer.c
# Opt level: O1

gtoken_t gravity_lexer_peek(gravity_lexer_t *lexer)

{
  gtoken_t gVar1;
  long lVar2;
  gravity_lexer_t *pgVar3;
  undefined8 *puVar4;
  byte bVar5;
  gravity_lexer_t saved;
  undefined8 local_70 [12];
  
  bVar5 = 0;
  gVar1 = lexer->cache;
  if (gVar1 == TOK_END) {
    lexer->peeking = true;
    pgVar3 = lexer;
    puVar4 = local_70;
    for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = pgVar3->buffer;
      pgVar3 = (gravity_lexer_t *)&pgVar3->offset;
      puVar4 = puVar4 + 1;
    }
    gVar1 = gravity_lexer_next(lexer);
    puVar4 = local_70;
    pgVar3 = lexer;
    for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
      pgVar3->buffer = (char *)*puVar4;
      puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
      pgVar3 = (gravity_lexer_t *)((long)pgVar3 + (ulong)bVar5 * -0x10 + 8);
    }
    lexer->peeking = false;
    lexer->cache = gVar1;
  }
  return gVar1;
}

Assistant:

gtoken_t gravity_lexer_peek (gravity_lexer_t *lexer) {
    if (lexer->cache != TOK_END) return lexer->cache;
    
    lexer->peeking = true;
    gravity_lexer_t saved = *lexer;

    gtoken_t result = gravity_lexer_next(lexer);

    *lexer = saved;
    lexer->peeking = false;

    lexer->cache = result;
    return result;
}